

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Save
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,
          OutputWriter *a_oOutput,bool a_bAddSignature)

{
  bool bVar1;
  pointer pEVar2;
  char *pcVar3;
  iterator local_118;
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
  local_110;
  iterator local_108;
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
  local_100;
  const_iterator iValue;
  TNamesDepend oValues;
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
  local_d8;
  iterator local_d0;
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
  local_c8;
  const_iterator iKey;
  undefined1 local_b8 [8];
  TNamesDepend oKeys;
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
  local_98;
  iterator local_90;
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
  local_88;
  const_iterator iSection;
  undefined1 local_78 [6];
  bool bNeedNewLine;
  TNamesDepend oSections;
  undefined1 local_50 [8];
  Converter convert;
  bool a_bAddSignature_local;
  OutputWriter *a_oOutput_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  convert.m_scratch.field_2._M_local_buf[0xf] = a_bAddSignature;
  Converter::Converter((Converter *)local_50,(bool)(this->m_bStoreIsUtf8 & 1));
  if (((this->m_bStoreIsUtf8 & 1U) != 0) &&
     ((convert.m_scratch.field_2._M_local_buf[0xf] & 1U) != 0)) {
    (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,anon_var_dwarf_c57c);
  }
  std::__cxx11::
  list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ::list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
          *)local_78);
  GetAllSections(this,(list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                       *)local_78);
  std::__cxx11::
  list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
  ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
            ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
              *)local_78);
  iSection._M_node._6_1_ = 0;
  if (this->m_pFileComment != (char *)0x0) {
    bVar1 = OutputMultiLineText(this,a_oOutput,(Converter *)local_50,this->m_pFileComment);
    if (!bVar1) {
      this_local._4_4_ = SI_FAIL;
      iSection._M_node._0_4_ = 1;
      goto LAB_001b580d;
    }
    iSection._M_node._6_1_ = 1;
  }
  local_90._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
       ::begin((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                *)local_78);
  std::
  _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>::
  _List_const_iterator(&local_88,&local_90);
  while( true ) {
    oKeys.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node._M_size =
         (size_t)std::__cxx11::
                 list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                 ::end((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                        *)local_78);
    std::
    _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>::
    _List_const_iterator
              (&local_98,
               (iterator *)
               &oKeys.
                super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ._M_impl._M_node._M_size);
    bVar1 = std::operator!=(&local_88,&local_98);
    if (!bVar1) break;
    pEVar2 = std::
             _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
             ::operator->(&local_88);
    if (pEVar2->pComment != (char *)0x0) {
      if ((iSection._M_node._6_1_ & 1) != 0) {
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      }
      pEVar2 = std::
               _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
               ::operator->(&local_88);
      bVar1 = OutputMultiLineText(this,a_oOutput,(Converter *)local_50,pEVar2->pComment);
      if (!bVar1) {
        this_local._4_4_ = SI_FAIL;
        iSection._M_node._0_4_ = 1;
        goto LAB_001b580d;
      }
      iSection._M_node._6_1_ = 0;
    }
    if ((iSection._M_node._6_1_ & 1) != 0) {
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
      iSection._M_node._6_1_ = 0;
    }
    pEVar2 = std::
             _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
             ::operator->(&local_88);
    if (*pEVar2->pItem != '\0') {
      pEVar2 = std::
               _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
               ::operator->(&local_88);
      bVar1 = Converter::ConvertToStore((Converter *)local_50,pEVar2->pItem);
      if (!bVar1) {
        this_local._4_4_ = SI_FAIL;
        iSection._M_node._0_4_ = 1;
        goto LAB_001b580d;
      }
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"[");
      pcVar3 = Converter::Data((Converter *)local_50);
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar3);
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"]");
      (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
    }
    std::__cxx11::
    list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ::list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
            *)local_b8);
    pEVar2 = std::
             _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
             ::operator->(&local_88);
    GetAllKeys(this,pEVar2->pItem,
               (list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                *)local_b8);
    std::__cxx11::
    list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
    ::sort<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::LoadOrder>
              ((list<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::allocator<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry>>
                *)local_b8);
    local_d0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
         ::begin((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                  *)local_b8);
    std::
    _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>::
    _List_const_iterator(&local_c8,&local_d0);
    while( true ) {
      oValues.
      super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ._M_impl._M_node._M_size =
           (size_t)std::__cxx11::
                   list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                   ::end((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                          *)local_b8);
      std::
      _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
      ::_List_const_iterator
                (&local_d8,
                 (iterator *)
                 &oValues.
                  super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                  ._M_impl._M_node._M_size);
      bVar1 = std::operator!=(&local_c8,&local_d8);
      if (!bVar1) break;
      std::__cxx11::
      list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ::list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
              *)&iValue);
      pEVar2 = std::
               _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
               ::operator->(&local_88);
      pcVar3 = pEVar2->pItem;
      pEVar2 = std::
               _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
               ::operator->(&local_c8);
      GetAllValues(this,pcVar3,pEVar2->pItem,
                   (list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                    *)&iValue);
      local_108._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           ::begin((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                    *)&iValue);
      std::
      _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
      ::_List_const_iterator(&local_100,&local_108);
      while( true ) {
        local_118._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
             ::end((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                    *)&iValue);
        std::
        _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
        ::_List_const_iterator(&local_110,&local_118);
        bVar1 = std::operator!=(&local_100,&local_110);
        if (!bVar1) break;
        pEVar2 = std::
                 _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                 ::operator->(&local_100);
        if (pEVar2->pComment != (char *)0x0) {
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
          pEVar2 = std::
                   _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                   ::operator->(&local_100);
          bVar1 = OutputMultiLineText(this,a_oOutput,(Converter *)local_50,pEVar2->pComment);
          if (!bVar1) {
            this_local._4_4_ = SI_FAIL;
            iSection._M_node._0_4_ = 1;
            goto LAB_001b5783;
          }
        }
        pEVar2 = std::
                 _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                 ::operator->(&local_c8);
        bVar1 = Converter::ConvertToStore((Converter *)local_50,pEVar2->pItem);
        if (!bVar1) {
          this_local._4_4_ = SI_FAIL;
          iSection._M_node._0_4_ = 1;
          goto LAB_001b5783;
        }
        pcVar3 = Converter::Data((Converter *)local_50);
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar3);
        pEVar2 = std::
                 _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                 ::operator->(&local_100);
        bVar1 = Converter::ConvertToStore((Converter *)local_50,pEVar2->pItem);
        if (!bVar1) {
          this_local._4_4_ = SI_FAIL;
          iSection._M_node._0_4_ = 1;
          goto LAB_001b5783;
        }
        pcVar3 = "=";
        if ((this->m_bSpaces & 1U) != 0) {
          pcVar3 = " = ";
        }
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar3);
        if ((this->m_bAllowMultiLine & 1U) == 0) {
LAB_001b571b:
          pcVar3 = Converter::Data((Converter *)local_50);
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,pcVar3);
        }
        else {
          pEVar2 = std::
                   _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                   ::operator->(&local_100);
          bVar1 = IsMultiLineData(this,pEVar2->pItem);
          if (!bVar1) goto LAB_001b571b;
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"<<<END_OF_TEXT\n");
          pEVar2 = std::
                   _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
                   ::operator->(&local_100);
          bVar1 = OutputMultiLineText(this,a_oOutput,(Converter *)local_50,pEVar2->pItem);
          if (!bVar1) {
            this_local._4_4_ = SI_FAIL;
            iSection._M_node._0_4_ = 1;
            goto LAB_001b5783;
          }
          (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"END_OF_TEXT");
        }
        (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
        std::
        _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
        ::operator++(&local_100);
      }
      iSection._M_node._0_4_ = 0;
LAB_001b5783:
      std::__cxx11::
      list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
      ::~list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
               *)&iValue);
      if ((int)iSection._M_node != 0) goto LAB_001b57b6;
      std::
      _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>
      ::operator++(&local_c8);
    }
    iSection._M_node._6_1_ = 1;
    iSection._M_node._0_4_ = 0;
LAB_001b57b6:
    std::__cxx11::
    list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ::~list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
             *)local_b8);
    if ((int)iSection._M_node != 0) goto LAB_001b580d;
    std::
    _List_const_iterator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>::
    operator++(&local_88);
  }
  (*a_oOutput->_vptr_OutputWriter[2])(a_oOutput,"\n");
  this_local._4_4_ = SI_OK;
  iSection._M_node._0_4_ = 1;
LAB_001b580d:
  std::__cxx11::
  list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
  ::~list((list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
           *)local_78);
  Converter::~Converter((Converter *)local_50);
  return this_local._4_4_;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::Save(OutputWriter &a_oOutput, bool a_bAddSignature) const {
	Converter convert(m_bStoreIsUtf8);

	// add the UTF-8 signature if it is desired
	if (m_bStoreIsUtf8 && a_bAddSignature) {
		a_oOutput.Write(SI_UTF8_SIGNATURE);
	}

	// get all of the sections sorted in load order
	TNamesDepend oSections;
	GetAllSections(oSections);
#if defined(_MSC_VER) && _MSC_VER <= 1200
	oSections.sort();
#elif defined(__BORLANDC__)
	oSections.sort(Entry::LoadOrder());
#else
	oSections.sort(typename Entry::LoadOrder());
#endif

	// write the file comment if we have one
	bool bNeedNewLine = false;
	if (m_pFileComment) {
		if (!OutputMultiLineText(a_oOutput, convert, m_pFileComment)) {
			return SI_FAIL;
		}
		bNeedNewLine = true;
	}

	// iterate through our sections and output the data
	typename TNamesDepend::const_iterator iSection = oSections.begin();
	for (; iSection != oSections.end(); ++iSection) {
		// write out the comment if there is one
		if (iSection->pComment) {
			if (bNeedNewLine) {
				a_oOutput.Write(SI_NEWLINE_A);
				a_oOutput.Write(SI_NEWLINE_A);
			}
			if (!OutputMultiLineText(a_oOutput, convert, iSection->pComment)) {
				return SI_FAIL;
			}
			bNeedNewLine = false;
		}

		if (bNeedNewLine) {
			a_oOutput.Write(SI_NEWLINE_A);
			a_oOutput.Write(SI_NEWLINE_A);
			bNeedNewLine = false;
		}

		// write the section (unless there is no section name)
		if (*iSection->pItem) {
			if (!convert.ConvertToStore(iSection->pItem)) {
				return SI_FAIL;
			}
			a_oOutput.Write("[");
			a_oOutput.Write(convert.Data());
			a_oOutput.Write("]");
			a_oOutput.Write(SI_NEWLINE_A);
		}

		// get all of the keys sorted in load order
		TNamesDepend oKeys;
		GetAllKeys(iSection->pItem, oKeys);
#if defined(_MSC_VER) && _MSC_VER <= 1200
		oKeys.sort();
#elif defined(__BORLANDC__)
		oKeys.sort(Entry::LoadOrder());
#else
		oKeys.sort(typename Entry::LoadOrder());
#endif

		// write all keys and values
		typename TNamesDepend::const_iterator iKey = oKeys.begin();
		for (; iKey != oKeys.end(); ++iKey) {
			// get all values for this key
			TNamesDepend oValues;
			GetAllValues(iSection->pItem, iKey->pItem, oValues);

			typename TNamesDepend::const_iterator iValue = oValues.begin();
			for (; iValue != oValues.end(); ++iValue) {
				// write out the comment if there is one
				if (iValue->pComment) {
					a_oOutput.Write(SI_NEWLINE_A);
					if (!OutputMultiLineText(a_oOutput, convert, iValue->pComment)) {
						return SI_FAIL;
					}
				}

				// write the key
				if (!convert.ConvertToStore(iKey->pItem)) {
					return SI_FAIL;
				}
				a_oOutput.Write(convert.Data());

				// write the value
				if (!convert.ConvertToStore(iValue->pItem)) {
					return SI_FAIL;
				}
				a_oOutput.Write(m_bSpaces ? " = " : "=");
				if (m_bAllowMultiLine && IsMultiLineData(iValue->pItem)) {
					// multi-line data needs to be processed specially to ensure
					// that we use the correct newline format for the current system
					a_oOutput.Write("<<<END_OF_TEXT" SI_NEWLINE_A);
					if (!OutputMultiLineText(a_oOutput, convert, iValue->pItem)) {
						return SI_FAIL;
					}
					a_oOutput.Write("END_OF_TEXT");
				} else {
					a_oOutput.Write(convert.Data());
				}
				a_oOutput.Write(SI_NEWLINE_A);
			}
		}

		bNeedNewLine = true;
	}

	// Append new empty line
	a_oOutput.Write(SI_NEWLINE_A);

	return SI_OK;
}